

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

_Bool sftp_get_file(char *fname,char *outfname,_Bool recurse,_Bool restart)

{
  void *pvVar1;
  _Bool _Var2;
  int iVar3;
  sftp_request *psVar4;
  sftp_packet *psVar5;
  char *pcVar6;
  fxp_name *pfVar7;
  fxp_handle *fh_00;
  fxp_xfer *xfer_00;
  char *pcVar8;
  unsigned_long local_190;
  uchar *buf;
  int wlen;
  int wpos;
  int len;
  int retd_1;
  void *vbuf;
  char *sano;
  char *san_7;
  char *san_6;
  char *san_5;
  char *san_4;
  char *pcStack_118;
  _Bool retd;
  char *nextoutfname_1;
  char *nextfname;
  char *pcStack_100;
  _Bool nonexistent;
  char *nextoutfname;
  char *san_3;
  char *san_2;
  char *pcStack_e0;
  int i_1;
  char *san_1;
  char *san;
  fxp_names *pfStack_c8;
  int i;
  fxp_names *names;
  fxp_name **ournames;
  size_t namesize;
  size_t nnames;
  fxp_handle *dirhandle;
  undefined1 auStack_98 [7];
  _Bool result;
  fxp_attrs attrs;
  _Bool shown_err;
  WFile *pWStack_58;
  _Bool toret;
  WFile *file;
  uint64_t offset;
  fxp_xfer *xfer;
  sftp_request *req;
  sftp_packet *pktin;
  fxp_handle *fh;
  _Bool restart_local;
  _Bool recurse_local;
  char *outfname_local;
  char *fname_local;
  
  attrs.mtime._6_1_ = 0;
  if (recurse) {
    psVar4 = fxp_stat_send(fname);
    psVar5 = sftp_wait_for_reply(psVar4);
    dirhandle._7_1_ = fxp_stat_recv(psVar5,psVar4,(fxp_attrs *)auStack_98);
    if ((((bool)dirhandle._7_1_) && ((_auStack_98 & 4) != 0)) && ((attrs.gid & 0x4000) != 0)) {
      iVar3 = file_type(outfname);
      if ((iVar3 != 2) && (_Var2 = create_directory(outfname), !_Var2)) {
        san_1 = stripctrl_string(string_scc,outfname);
        while (san_1 != (char *)0x0) {
          printf("%s: Cannot create directory\n",san_1);
          safefree(san_1);
          san_1 = (char *)0x0;
        }
        return false;
      }
      psVar4 = fxp_opendir_send(fname);
      psVar5 = sftp_wait_for_reply(psVar4);
      nnames = (size_t)fxp_opendir_recv(psVar5,psVar4);
      if ((fxp_handle *)nnames == (fxp_handle *)0x0) {
        pcStack_e0 = stripctrl_string(string_scc,fname);
        while (pcVar8 = pcStack_e0, pcStack_e0 != (char *)0x0) {
          pcVar6 = fxp_error();
          printf("%s: unable to open directory: %s\n",pcVar8,pcVar6);
          safefree(pcStack_e0);
          pcStack_e0 = (char *)0x0;
        }
        return false;
      }
      ournames = (fxp_name **)0x0;
      namesize = 0;
      names = (fxp_names *)0x0;
      while( true ) {
        psVar4 = fxp_readdir_send((fxp_handle *)nnames);
        psVar5 = sftp_wait_for_reply(psVar4);
        pfStack_c8 = fxp_readdir_recv(psVar5,psVar4);
        if (pfStack_c8 == (fxp_names *)0x0) break;
        if (pfStack_c8->nnames == 0) {
          fxp_free_names(pfStack_c8);
          goto LAB_0010f151;
        }
        names = (fxp_names *)
                safegrowarray(names,(size_t *)&ournames,8,namesize,(long)pfStack_c8->nnames,false);
        for (san_2._4_4_ = 0; san_2._4_4_ < pfStack_c8->nnames; san_2._4_4_ = san_2._4_4_ + 1) {
          iVar3 = strcmp(pfStack_c8->names[san_2._4_4_].filename,".");
          if ((iVar3 != 0) &&
             (iVar3 = strcmp(pfStack_c8->names[san_2._4_4_].filename,".."), iVar3 != 0)) {
            _Var2 = vet_filename(pfStack_c8->names[san_2._4_4_].filename);
            if (_Var2) {
              pfVar7 = fxp_dup_name(pfStack_c8->names + san_2._4_4_);
              *(fxp_name **)(&names->nnames + namesize * 2) = pfVar7;
              namesize = namesize + 1;
            }
            else {
              nextoutfname = stripctrl_string(string_scc,pfStack_c8->names[san_2._4_4_].filename);
              while (nextoutfname != (char *)0x0) {
                printf("ignoring potentially dangerous server-supplied filename \'%s\'\n",
                       nextoutfname);
                safefree(nextoutfname);
                nextoutfname = (char *)0x0;
              }
            }
          }
        }
        fxp_free_names(pfStack_c8);
      }
      iVar3 = fxp_error_type();
      if (iVar3 != 1) {
        san_3 = stripctrl_string(string_scc,fname);
        while (pcVar8 = san_3, san_3 != (char *)0x0) {
          pcVar6 = fxp_error();
          printf("%s: reading directory: %s\n",pcVar8,pcVar6);
          safefree(san_3);
          san_3 = (char *)0x0;
        }
        psVar4 = fxp_close_send((fxp_handle *)nnames);
        psVar5 = sftp_wait_for_reply(psVar4);
        fxp_close_recv(psVar5,psVar4);
        safefree(names);
        return false;
      }
LAB_0010f151:
      psVar4 = fxp_close_send((fxp_handle *)nnames);
      psVar5 = sftp_wait_for_reply(psVar4);
      fxp_close_recv(psVar5,psVar4);
      if (namesize != 0) {
        qsort(names,namesize,8,sftp_name_compare);
      }
      san._4_4_ = 0;
      fh._6_1_ = restart;
      if (restart) {
        for (; (ulong)(long)san._4_4_ < namesize; san._4_4_ = san._4_4_ + 1) {
          pcStack_100 = dir_file_cat(outfname,(char *)**(undefined8 **)
                                                        (&names->nnames + (long)san._4_4_ * 2));
          iVar3 = file_type(pcStack_100);
          nextfname._7_1_ = iVar3 == 0;
          safefree(pcStack_100);
          if ((nextfname._7_1_ & 1) != 0) break;
        }
        if (0 < san._4_4_) {
          san._4_4_ = san._4_4_ + -1;
        }
      }
      while( true ) {
        if (namesize <= (ulong)(long)san._4_4_) {
          for (san._4_4_ = 0; (ulong)(long)san._4_4_ < namesize; san._4_4_ = san._4_4_ + 1) {
            fxp_free_name(*(fxp_name **)(&names->nnames + (long)san._4_4_ * 2));
          }
          safefree(names);
          return true;
        }
        nextoutfname_1 =
             dupcat_fn(fname,"/",**(undefined8 **)(&names->nnames + (long)san._4_4_ * 2),0);
        pcStack_118 = dir_file_cat(outfname,(char *)**(undefined8 **)
                                                      (&names->nnames + (long)san._4_4_ * 2));
        san_4._7_1_ = sftp_get_file(nextoutfname_1,pcStack_118,recurse,(_Bool)(fh._6_1_ & 1));
        fh._6_1_ = 0;
        safefree(pcStack_118);
        safefree(nextoutfname_1);
        if ((san_4._7_1_ & 1) == 0) break;
        san._4_4_ = san._4_4_ + 1;
      }
      for (san._4_4_ = 0; (ulong)(long)san._4_4_ < namesize; san._4_4_ = san._4_4_ + 1) {
        fxp_free_name(*(fxp_name **)(&names->nnames + (long)san._4_4_ * 2));
      }
      safefree(names);
      return false;
    }
  }
  psVar4 = fxp_stat_send(fname);
  psVar5 = sftp_wait_for_reply(psVar4);
  _Var2 = fxp_stat_recv(psVar5,psVar4,(fxp_attrs *)auStack_98);
  if (!_Var2) {
    _auStack_98 = 0;
  }
  psVar4 = fxp_open_send(fname,1,(fxp_attrs *)0x0);
  psVar5 = sftp_wait_for_reply(psVar4);
  fh_00 = fxp_open_recv(psVar5,psVar4);
  if (fh_00 == (fxp_handle *)0x0) {
    san_5 = stripctrl_string(string_scc,fname);
    while (pcVar8 = san_5, san_5 != (char *)0x0) {
      pcVar6 = fxp_error();
      printf("%s: open for read: %s\n",pcVar8,pcVar6);
      safefree(san_5);
      san_5 = (char *)0x0;
    }
    fname_local._7_1_ = false;
  }
  else {
    if (restart) {
      pWStack_58 = open_existing_wfile(outfname,(uint64_t *)0x0);
    }
    else {
      if ((_auStack_98 & 4) == 0) {
        local_190 = 0xffffffffffffffff;
      }
      else {
        local_190 = attrs.gid;
      }
      pWStack_58 = open_new_file(outfname,local_190);
    }
    if (pWStack_58 == (WFile *)0x0) {
      san_6 = stripctrl_string(string_scc,outfname);
      while (san_6 != (char *)0x0) {
        printf("local: unable to open %s\n",san_6);
        safefree(san_6);
        san_6 = (char *)0x0;
      }
      psVar4 = fxp_close_send(fh_00);
      psVar5 = sftp_wait_for_reply(psVar4);
      fxp_close_recv(psVar5,psVar4);
      fname_local._7_1_ = false;
    }
    else {
      if (restart) {
        iVar3 = seek_file(pWStack_58,0,2);
        if (iVar3 == -1) {
          close_wfile(pWStack_58);
          san_7 = stripctrl_string(string_scc,outfname);
          while (san_7 != (char *)0x0) {
            printf("reget: cannot restart %s - file too large\n",san_7);
            safefree(san_7);
            san_7 = (char *)0x0;
          }
          psVar4 = fxp_close_send(fh_00);
          psVar5 = sftp_wait_for_reply(psVar4);
          fxp_close_recv(psVar5,psVar4);
          return false;
        }
        file = (WFile *)get_file_posn(pWStack_58);
        printf("reget: restarting at file position %lu\n",file);
      }
      else {
        file = (WFile *)0x0;
      }
      sano = stripctrl_string(string_scc,fname);
      while (sano != (char *)0x0) {
        vbuf = stripctrl_string(string_scc,outfname);
        while (vbuf != (void *)0x0) {
          printf("remote:%s => local:%s\n",sano,vbuf);
          safefree(vbuf);
          vbuf = (void *)0x0;
        }
        safefree(sano);
        sano = (char *)0x0;
      }
      attrs.mtime._7_1_ = 1;
      xfer_00 = xfer_download_init(fh_00,(uint64_t)file);
      while (_Var2 = xfer_done(xfer_00), ((_Var2 ^ 0xffU) & 1) != 0) {
        xfer_download_queue(xfer_00);
        psVar5 = sftp_recv();
        wpos = xfer_download_gotpkt(xfer_00,psVar5);
        if (wpos < 1) {
          if ((attrs.mtime._6_1_ & 1) == 0) {
            pcVar8 = fxp_error();
            printf("error while reading: %s\n",pcVar8);
            attrs.mtime._6_1_ = 1;
          }
          if (wpos == -0x80000000) {
            safefree(psVar5);
          }
          attrs.mtime._7_1_ = 0;
        }
        while (_Var2 = xfer_download_data(xfer_00,(void **)&len,&wlen), pvVar1 = _len, _Var2) {
          for (buf._4_4_ = 0; buf._4_4_ < wlen; buf._4_4_ = iVar3 + buf._4_4_) {
            iVar3 = write_to_file(pWStack_58,(void *)((long)pvVar1 + (long)buf._4_4_),
                                  wlen - buf._4_4_);
            if (iVar3 < 1) {
              printf("error while writing local file\n");
              attrs.mtime._7_1_ = 0;
              xfer_set_error(xfer_00);
              break;
            }
          }
          if (buf._4_4_ < wlen) {
            attrs.mtime._7_1_ = 0;
            xfer_set_error(xfer_00);
          }
          safefree(_len);
        }
      }
      xfer_cleanup(xfer_00);
      close_wfile(pWStack_58);
      psVar4 = fxp_close_send(fh_00);
      psVar5 = sftp_wait_for_reply(psVar4);
      fxp_close_recv(psVar5,psVar4);
      fname_local._7_1_ = (_Bool)(attrs.mtime._7_1_ & 1);
    }
  }
  return fname_local._7_1_;
}

Assistant:

bool sftp_get_file(char *fname, char *outfname, bool recurse, bool restart)
{
    struct fxp_handle *fh;
    struct sftp_packet *pktin;
    struct sftp_request *req;
    struct fxp_xfer *xfer;
    uint64_t offset;
    WFile *file;
    bool toret, shown_err = false;
    struct fxp_attrs attrs;

    /*
     * In recursive mode, see if we're dealing with a directory.
     * (If we're not in recursive mode, we need not even check: the
     * subsequent FXP_OPEN will return a usable error message.)
     */
    if (recurse) {
        bool result;

        req = fxp_stat_send(fname);
        pktin = sftp_wait_for_reply(req);
        result = fxp_stat_recv(pktin, req, &attrs);

        if (result &&
            (attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS) &&
            (attrs.permissions & 0040000)) {

            struct fxp_handle *dirhandle;
            size_t nnames, namesize;
            struct fxp_name **ournames;
            struct fxp_names *names;
            int i;

            /*
             * First, attempt to create the destination directory,
             * unless it already exists.
             */
            if (file_type(outfname) != FILE_TYPE_DIRECTORY &&
                !create_directory(outfname)) {
                with_stripctrl(san, outfname)
                    printf("%s: Cannot create directory\n", san);
                return false;
            }

            /*
             * Now get the list of filenames in the remote
             * directory.
             */
            req = fxp_opendir_send(fname);
            pktin = sftp_wait_for_reply(req);
            dirhandle = fxp_opendir_recv(pktin, req);

            if (!dirhandle) {
                with_stripctrl(san, fname)
                    printf("%s: unable to open directory: %s\n",
                           san, fxp_error());
                return false;
            }
            nnames = namesize = 0;
            ournames = NULL;
            while (1) {
                int i;

                req = fxp_readdir_send(dirhandle);
                pktin = sftp_wait_for_reply(req);
                names = fxp_readdir_recv(pktin, req);

                if (names == NULL) {
                    if (fxp_error_type() == SSH_FX_EOF)
                        break;
                    with_stripctrl(san, fname)
                        printf("%s: reading directory: %s\n",
                               san, fxp_error());

                    req = fxp_close_send(dirhandle);
                    pktin = sftp_wait_for_reply(req);
                    fxp_close_recv(pktin, req);

                    sfree(ournames);
                    return false;
                }
                if (names->nnames == 0) {
                    fxp_free_names(names);
                    break;
                }
                sgrowarrayn(ournames, namesize, nnames, names->nnames);
                for (i = 0; i < names->nnames; i++)
                    if (strcmp(names->names[i].filename, ".") &&
                        strcmp(names->names[i].filename, "..")) {
                        if (!vet_filename(names->names[i].filename)) {
                            with_stripctrl(san, names->names[i].filename)
                                printf("ignoring potentially dangerous server-"
                                       "supplied filename '%s'\n", san);
                        } else {
                            ournames[nnames++] =
                                fxp_dup_name(&names->names[i]);
                        }
                    }
                fxp_free_names(names);
            }
            req = fxp_close_send(dirhandle);
            pktin = sftp_wait_for_reply(req);
            fxp_close_recv(pktin, req);

            /*
             * Sort the names into a clear order. This ought to
             * make things more predictable when we're doing a
             * reget of the same directory, just in case two
             * readdirs on the same remote directory return a
             * different order.
             */
            if (nnames > 0)
                qsort(ournames, nnames, sizeof(*ournames), sftp_name_compare);

            /*
             * If we're in restart mode, find the last filename on
             * this list that already exists. We may have to do a
             * reget on _that_ file, but shouldn't have to do
             * anything on the previous files.
             *
             * If none of them exists, of course, we start at 0.
             */
            i = 0;
            if (restart) {
                while (i < nnames) {
                    char *nextoutfname;
                    bool nonexistent;
                    nextoutfname = dir_file_cat(outfname,
                                                ournames[i]->filename);
                    nonexistent = (file_type(nextoutfname) ==
                                   FILE_TYPE_NONEXISTENT);
                    sfree(nextoutfname);
                    if (nonexistent)
                        break;
                    i++;
                }
                if (i > 0)
                    i--;
            }

            /*
             * Now we're ready to recurse. Starting at ournames[i]
             * and continuing on to the end of the list, we
             * construct a new source and target file name, and
             * call sftp_get_file again.
             */
            for (; i < nnames; i++) {
                char *nextfname, *nextoutfname;
                bool retd;

                nextfname = dupcat(fname, "/", ournames[i]->filename);
                nextoutfname = dir_file_cat(outfname, ournames[i]->filename);
                retd = sftp_get_file(
                    nextfname, nextoutfname, recurse, restart);
                restart = false;       /* after first partial file, do full */
                sfree(nextoutfname);
                sfree(nextfname);
                if (!retd) {
                    for (i = 0; i < nnames; i++) {
                        fxp_free_name(ournames[i]);
                    }
                    sfree(ournames);
                    return false;
                }
            }

            /*
             * Done this recursion level. Free everything.
             */
            for (i = 0; i < nnames; i++) {
                fxp_free_name(ournames[i]);
            }
            sfree(ournames);

            return true;
        }
    }

    req = fxp_stat_send(fname);
    pktin = sftp_wait_for_reply(req);
    if (!fxp_stat_recv(pktin, req, &attrs))
        attrs.flags = 0;

    req = fxp_open_send(fname, SSH_FXF_READ, NULL);
    pktin = sftp_wait_for_reply(req);
    fh = fxp_open_recv(pktin, req);

    if (!fh) {
        with_stripctrl(san, fname)
            printf("%s: open for read: %s\n", san, fxp_error());
        return false;
    }

    if (restart) {
        file = open_existing_wfile(outfname, NULL);
    } else {
        file = open_new_file(outfname, GET_PERMISSIONS(attrs, -1));
    }

    if (!file) {
        with_stripctrl(san, outfname)
            printf("local: unable to open %s\n", san);

        req = fxp_close_send(fh);
        pktin = sftp_wait_for_reply(req);
        fxp_close_recv(pktin, req);

        return false;
    }

    if (restart) {
        if (seek_file(file, 0, FROM_END) == -1) {
            close_wfile(file);
            with_stripctrl(san, outfname)
                printf("reget: cannot restart %s - file too large\n", san);
            req = fxp_close_send(fh);
            pktin = sftp_wait_for_reply(req);
            fxp_close_recv(pktin, req);

            return false;
        }

        offset = get_file_posn(file);
        printf("reget: restarting at file position %"PRIu64"\n", offset);
    } else {
        offset = 0;
    }

    with_stripctrl(san, fname) {
        with_stripctrl(sano, outfname)
            printf("remote:%s => local:%s\n", san, sano);
    }

    /*
     * FIXME: we can use FXP_FSTAT here to get the file size, and
     * thus put up a progress bar.
     */
    toret = true;
    xfer = xfer_download_init(fh, offset);
    while (!xfer_done(xfer)) {
        void *vbuf;
        int retd, len;
        int wpos, wlen;

        xfer_download_queue(xfer);
        pktin = sftp_recv();
        retd = xfer_download_gotpkt(xfer, pktin);
        if (retd <= 0) {
            if (!shown_err) {
                printf("error while reading: %s\n", fxp_error());
                shown_err = true;
            }
            if (retd == INT_MIN)        /* pktin not even freed */
                sfree(pktin);
            toret = false;
        }

        while (xfer_download_data(xfer, &vbuf, &len)) {
            unsigned char *buf = (unsigned char *)vbuf;

            wpos = 0;
            while (wpos < len) {
                wlen = write_to_file(file, buf + wpos, len - wpos);
                if (wlen <= 0) {
                    printf("error while writing local file\n");
                    toret = false;
                    xfer_set_error(xfer);
                    break;
                }
                wpos += wlen;
            }
            if (wpos < len) {          /* we had an error */
                toret = false;
                xfer_set_error(xfer);
            }

            sfree(vbuf);
        }
    }

    xfer_cleanup(xfer);

    close_wfile(file);

    req = fxp_close_send(fh);
    pktin = sftp_wait_for_reply(req);
    fxp_close_recv(pktin, req);

    return toret;
}